

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

bool GetLabelValue(char **p,aint *val)

{
  SLabelTableEntry *pSVar1;
  int iVar2;
  
  pSVar1 = GetLabel(p);
  if (pSVar1 == (SLabelTableEntry *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = pSVar1->value;
    *val = iVar2;
    if (Relocation::areLabelsOffset != '\x01') goto LAB_00130579;
    if (pSVar1->isRelocatable == HIGH) {
      iVar2 = iVar2 + (Relocation::alternative_offset >> 8);
    }
    else {
      if (pSVar1->isRelocatable != REGULAR) goto LAB_00130579;
      iVar2 = iVar2 + Relocation::alternative_offset;
    }
  }
  *val = iVar2;
LAB_00130579:
  return (bool)(getLabel_invalidName ^ 1);
}

Assistant:

bool GetLabelValue(char*& p, aint& val) {
	SLabelTableEntry* labelEntry = GetLabel(p);
	if (labelEntry) {
		val = labelEntry->value;
		if (Relocation::areLabelsOffset) {
			switch (labelEntry->isRelocatable) {
				case Relocation::REGULAR:	val += Relocation::alternative_offset;			break;
				case Relocation::HIGH:		val += Relocation::alternative_offset >> 8;		break;
				default:					;
			}
		}
	} else {
		val = 0;
	}
	// true even when not found, but valid label name (needed for expression-eval logic)
	return !getLabel_invalidName;
}